

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

Matrix<double,__1,_1,_0,__1,_1> * __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::operator()(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *this,uint d0,...)

{
  undefined8 *puVar1;
  va_list vl;
  uint local_a8;
  
  if ((d0 < this->_dims[0]) && (local_a8 < this->_dims[1])) {
    return this->_array + (this->_dims[1] * d0 + local_a8);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Index out of bounds!";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            return _array[index];
        }